

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall wasm::TypeUpdater::discoverBreaks(TypeUpdater *this,Expression *curr,int change)

{
  anon_class_16_2_37b1e3ab func;
  int local_c [2];
  int change_local;
  
  func.change = local_c;
  func.this = this;
  local_c[0] = change;
  BranchUtils::
  operateOnScopeNameUsesAndSentTypes<wasm::TypeUpdater::discoverBreaks(wasm::Expression*,int)::_lambda(wasm::Name&,wasm::Type)_1_>
            (curr,func);
  return;
}

Assistant:

void discoverBreaks(Expression* curr, int change) {
    BranchUtils::operateOnScopeNameUsesAndSentTypes(
      curr,
      [&](Name& name, Type type) { noteBreakChange(name, change, type); });
    // TODO: it may be faster to accumulate all changes to a set first, then
    // call noteBreakChange on the unique values, as a switch can be quite
    // large and have lots of repeated targets.
  }